

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubD::ClearEdgeSharpness(ON_SubD *this)

{
  ON_SubDimple *this_00;
  bool bVar1;
  uint uVar2;
  ON_SubDEdgeIterator eit;
  ON_SubDEdgeIterator OStack_58;
  
  ON_SubDEdgeIterator::ON_SubDEdgeIterator(&OStack_58,this);
  OStack_58.m_edge_index = 0;
  OStack_58.m_e_current = OStack_58.m_e_first;
  uVar2 = 0;
  if (OStack_58.m_e_first != (ON_SubDEdge *)0x0) {
    do {
      bVar1 = ON_SubDEdge::ClearSharpnessForExperts(OStack_58.m_e_first);
      if (bVar1) {
        ON_SubDEdge::ClearSavedSubdivisionPoints(OStack_58.m_e_first,true);
        uVar2 = uVar2 + 1;
      }
      OStack_58.m_e_first = ON_SubDEdgeIterator::NextEdge(&OStack_58);
    } while (OStack_58.m_e_first != (ON_SubDEdge *)0x0);
    if ((this != &Empty && uVar2 != 0) &&
       (this_00 = (this->m_subdimple_sp).
                  super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       this_00 != (ON_SubDimple *)0x0)) {
      ON_SubDimple::ChangeGeometryContentSerialNumber(this_00,true);
    }
  }
  ON_SubDRef::~ON_SubDRef(&OStack_58.m_subd_ref);
  return uVar2;
}

Assistant:

unsigned int ON_SubD::ClearEdgeSharpness()
{
  unsigned int sharp_edge_count = 0;
  ON_SubDEdgeIterator eit = this->EdgeIterator();
  for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
  {
    if (const_cast<ON_SubDEdge*>(e)->ClearSharpnessForExperts())
    {
      e->ClearSavedSubdivisionPoints(true);
      ++sharp_edge_count;
    }
  }
  
  if (sharp_edge_count != 0)
    this->ChangeGeometryContentSerialNumberForExperts(true);

  return sharp_edge_count;
}